

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_name_resolver.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::java::ClassNameResolver::HasConflictingClassName
          (ClassNameResolver *this,FileDescriptor *file,string *classname)

{
  undefined8 *puVar1;
  __type _Var2;
  bool bVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  lVar6 = -1;
  lVar5 = 0;
  while (lVar6 = lVar6 + 1, lVar6 < *(int *)(file + 0x68)) {
    puVar1 = (undefined8 *)(*(long *)(file + 0x70) + lVar5);
    lVar5 = lVar5 + 0x38;
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            *puVar1,classname);
    if (_Var2) {
      return true;
    }
  }
  lVar6 = -1;
  lVar5 = 0;
  do {
    lVar6 = lVar6 + 1;
    if (*(int *)(file + 0x78) <= lVar6) {
      lVar6 = -1;
      lVar5 = 0;
      do {
        lVar4 = (long)*(int *)(file + 0x58);
        lVar6 = lVar6 + 1;
        if (lVar4 <= lVar6) {
          return lVar6 < lVar4;
        }
        bVar3 = anon_unknown_0::MessageHasConflictingClassName
                          ((Descriptor *)(lVar5 + *(long *)(file + 0x60)),classname);
        lVar5 = lVar5 + 0xa8;
      } while (!bVar3);
      return lVar6 < lVar4;
    }
    puVar1 = (undefined8 *)(*(long *)(file + 0x80) + lVar5);
    lVar5 = lVar5 + 0x30;
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            *puVar1,classname);
  } while (!_Var2);
  return true;
}

Assistant:

bool ClassNameResolver::HasConflictingClassName(
    const FileDescriptor* file, const string& classname) {
  for (int i = 0; i < file->enum_type_count(); i++) {
    if (file->enum_type(i)->name() == classname) {
      return true;
    }
  }
  for (int i = 0; i < file->service_count(); i++) {
    if (file->service(i)->name() == classname) {
      return true;
    }
  }
  for (int i = 0; i < file->message_type_count(); i++) {
    if (MessageHasConflictingClassName(file->message_type(i), classname)) {
      return true;
    }
  }
  return false;
}